

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O1

glyph_t __thiscall QFontEngine::findGlyph(QFontEngine *this,QLatin1StringView name)

{
  char cVar1;
  glyph_t gVar2;
  glyph_t gVar3;
  hb_face_t *phVar4;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QLatin1String QVar9;
  QLatin1String QVar10;
  hb_codepoint_t glyph;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  uVar6 = name.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  phVar4 = hb_qt_face_get_for_engine(this);
  lVar5 = hb_font_create(phVar4);
  if (lVar5 == 0) {
    gVar2 = 0;
  }
  else {
    hb_ot_font_set_funcs(lVar5);
    local_48 = (undefined1 *)CONCAT44(local_48._4_4_,0xaaaaaaaa);
    gVar2 = hb_font_get_glyph_from_name(lVar5,name.m_data,uVar6 & 0xffffffff);
    if (gVar2 != 0) {
      gVar2 = (glyph_t)local_48;
    }
    hb_font_destroy(lVar5);
  }
  if (gVar2 != 0) goto LAB_004a91f6;
  QVar9.m_data = "gid";
  QVar9.m_size = 3;
  cVar1 = QtPrivate::startsWith(name,QVar9,CaseSensitive);
  if (cVar1 == '\0') {
    QVar10.m_data = "uni";
    QVar10.m_size = 3;
    cVar1 = QtPrivate::startsWith(name,QVar10,CaseSensitive);
    gVar2 = 0;
    if (cVar1 == '\0') goto LAB_004a91f6;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QVar8.m_data = (storage_type *)(uVar6 - 3);
    QVar8.m_size = (qsizetype)&local_48;
    QtPrivate::toUnsignedInteger(QVar8,(int)name.m_data + 3);
    if (((ulong)local_48 >> 0x20 != 0 || ((ulong)puStack_40 & 1) != 0) ||
       (gVar3 = (*this->_vptr_QFontEngine[0xb])(this), gVar3 == 0)) goto LAB_004a91f6;
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QVar7.m_data = (storage_type *)(uVar6 - 3);
    QVar7.m_size = (qsizetype)&local_48;
    QtPrivate::toUnsignedInteger(QVar7,(int)name.m_data + 3);
    gVar2 = 0;
    if (((ulong)puStack_40 & 1) != 0 || (ulong)local_48 >> 0x20 != 0) goto LAB_004a91f6;
    gVar3 = (glyph_t)local_48;
  }
  gVar2 = gVar3;
  (*this->_vptr_QFontEngine[0x2c])(this);
LAB_004a91f6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return gVar2;
}

Assistant:

glyph_t QFontEngine::findGlyph(QLatin1StringView name) const
{
    glyph_t result = 0;

#if QT_CONFIG(harfbuzz)
    result = queryHarfbuzz(this, [name](hb_font_t *hbFont){
        // glyph names are all ASCII, so latin1 is fine here.
        hb_codepoint_t glyph;
        if (hb_font_get_glyph_from_name(hbFont, name.constData(), name.size(), &glyph))
            return glyph_t(glyph);
        return glyph_t(0);
    });
#else // if we are here, no point in trying again if we already tried harfbuzz
    if (!result) {
        for (glyph_t index = 0; index < uint(glyphCount()); ++index) {
            if (name == glyphName(index))
                return index;
        }
    }
#endif

    if (!result) {
        constexpr auto gid = "gid"_L1;
        constexpr auto uni = "uni"_L1;
        if (name.startsWith(gid)) {
            bool ok;
            result = name.slice(gid.size()).toUInt(&ok);
            if (ok && result < glyph_t(glyphCount()))
                return result;
        } else if (name.startsWith(uni)) {
            bool ok;
            const uint ucs4 = name.slice(uni.size()).toUInt(&ok, 16);
            if (ok) {
                result = glyphIndex(ucs4);
                if (result > 0 && result < glyph_t(glyphCount()))
                    return result;
            }
        }
    }

    return result;
}